

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

void __thiscall TRM::ActiveEdgeList::rewind(ActiveEdgeList *this,FILE *__stream)

{
  Vertex *pVVar1;
  bool bVar2;
  Vertex *in_RDX;
  Vertex *top;
  Edge *e_1;
  Edge *left;
  Edge *e;
  Vertex *v;
  Vertex *dst_local;
  Vertex **current_local;
  ActiveEdgeList *this_local;
  
  if (((__stream != (FILE *)0x0) && (*(Vertex **)__stream != in_RDX)) &&
     (bVar2 = VertexCompare::Compare((vec2 *)(*(long *)__stream + 0x48),&in_RDX->point), !bVar2)) {
    e = *(Edge **)__stream;
    v = in_RDX;
    while (e != (Edge *)v) {
      e = (Edge *)e->top;
      for (left = ((LinkedList<TRM::Edge> *)&e->below_prev)->head; left != (Edge *)0x0;
          left = left->below_next) {
        remove(this,(char *)left);
      }
      e_1 = e->left;
      for (top = (Vertex *)((LinkedList<TRM::Edge> *)&e->above_prev)->head; top != (Vertex *)0x0;
          top = (Vertex *)(top->edge_above).tail) {
        insert(this,(Edge *)top,e_1);
        e_1 = (Edge *)top;
        pVVar1 = top->prev;
        bVar2 = VertexCompare::Compare(&pVVar1->point,&v->point);
        if ((bVar2) &&
           (((pVVar1->left != (Edge *)0x0 &&
             (bVar2 = Edge::is_left_of(pVVar1->left,&top->prev->point), !bVar2)) ||
            ((pVVar1->right != (Edge *)0x0 &&
             (bVar2 = Edge::is_right_of(pVVar1->right,&top->prev->point), !bVar2)))))) {
          v = pVVar1;
        }
      }
    }
    *(Edge **)__stream = e;
  }
  return;
}

Assistant:

void ActiveEdgeList::rewind(Vertex** current, Vertex* dst) {
  if (!current || *current == dst ||
      VertexCompare::Compare((*current)->point, dst->point)) {
    return;
  }

  Vertex* v = *current;

  while (v != dst) {
    v = v->prev;

    for (auto e = v->edge_below.head; e; e = e->below_next) {
      this->remove(e);
    }

    auto left = v->left;

    for (auto e = v->edge_above.head; e; e = e->above_next) {
      this->insert(e, left);
      left = e;

      auto top = e->top;
      if (VertexCompare::Compare(top->point, dst->point) &&
          ((top->left && !top->left->is_left_of(e->top->point)) ||
           (top->right && !top->right->is_right_of(e->top->point)))) {
        dst = top;
      }
    }
  }

  *current = v;
}